

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

bool __thiscall wasm::Literal::operator==(Literal *this,Literal *other)

{
  Type *this_00;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  BasicType BVar5;
  HeapType HVar6;
  undefined1 auVar7 [16];
  Literal local_58;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  
  uVar1 = (this->type).id;
  if (uVar1 != (other->type).id) {
    return false;
  }
  this_00 = &this->type;
  if (uVar1 < 7) {
    BVar5 = wasm::Type::getBasic(this_00);
    switch(BVar5) {
    case none:
      bVar4 = true;
      break;
    default:
switchD_00c93c40_caseD_1:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x1cf);
    case i32:
    case f32:
      goto switchD_00c93c40_caseD_2;
    case i64:
    case f64:
switchD_00c93c40_caseD_3:
      bVar4 = (this->field_0).i64 == (other->field_0).i64;
      break;
    case v128:
      auVar7[0] = -((this->field_0).v128[0] == (other->field_0).v128[0]);
      auVar7[1] = -((this->field_0).v128[1] == (other->field_0).v128[1]);
      auVar7[2] = -((this->field_0).v128[2] == (other->field_0).v128[2]);
      auVar7[3] = -((this->field_0).v128[3] == (other->field_0).v128[3]);
      auVar7[4] = -((this->field_0).v128[4] == (other->field_0).v128[4]);
      auVar7[5] = -((this->field_0).v128[5] == (other->field_0).v128[5]);
      auVar7[6] = -((this->field_0).v128[6] == (other->field_0).v128[6]);
      auVar7[7] = -((this->field_0).v128[7] == (other->field_0).v128[7]);
      auVar7[8] = -((this->field_0).v128[8] == (other->field_0).v128[8]);
      auVar7[9] = -((this->field_0).v128[9] == (other->field_0).v128[9]);
      auVar7[10] = -((this->field_0).v128[10] == (other->field_0).v128[10]);
      auVar7[0xb] = -((this->field_0).v128[0xb] == (other->field_0).v128[0xb]);
      auVar7[0xc] = -((this->field_0).v128[0xc] == (other->field_0).v128[0xc]);
      auVar7[0xd] = -((this->field_0).v128[0xd] == (other->field_0).v128[0xd]);
      auVar7[0xe] = -((this->field_0).v128[0xe] == (other->field_0).v128[0xe]);
      auVar7[0xf] = -((this->field_0).v128[0xf] == (other->field_0).v128[0xf]);
      bVar4 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff;
    }
  }
  else {
    if ((uVar1 & 1) != 0) goto switchD_00c93c40_caseD_1;
    bVar4 = wasm::Type::isNull(this_00);
    if (bVar4) {
      return true;
    }
    bVar4 = wasm::Type::isFunction(this_00);
    if (bVar4) {
      pcVar2 = (this->field_0).func.super_IString.str._M_str;
      if ((pcVar2 != (char *)0x0) &&
         (pcVar3 = (other->field_0).func.super_IString.str._M_str, pcVar3 != (char *)0x0)) {
        return pcVar2 == pcVar3;
      }
      __assert_fail("func.is() && other.func.is()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x1bd,"bool wasm::Literal::operator==(const Literal &) const");
    }
    bVar4 = wasm::Type::isString(this_00);
    if (bVar4) {
      bVar4 = SmallVector<wasm::Literal,_1UL>::operator==
                        (&(((this->field_0).gcData.
                            super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          values).super_SmallVector<wasm::Literal,_1UL>,
                         &(((other->field_0).gcData.
                            super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          values).super_SmallVector<wasm::Literal,_1UL>);
      return bVar4;
    }
    bVar4 = wasm::Type::isData(this_00);
    if (bVar4) goto switchD_00c93c40_caseD_3;
    HVar6 = wasm::Type::getHeapType(this_00);
    if (0x7c < HVar6.id) {
      __assert_fail("type.getHeapType().isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x1c6,"bool wasm::Literal::operator==(const Literal &) const");
    }
    local_40.i64 = (int64_t)wasm::Type::getHeapType(this_00);
    bVar4 = HeapType::isMaybeShared((HeapType *)&local_40.func,i31);
    if (!bVar4) {
      local_40.i64 = (int64_t)wasm::Type::getHeapType(this_00);
      bVar4 = HeapType::isMaybeShared((HeapType *)&local_40.func,ext);
      if (bVar4) {
        internalize((Literal *)&local_40.func,this);
        internalize(&local_58,other);
        bVar4 = operator==((Literal *)&local_40.func,&local_58);
        ~Literal(&local_58);
        ~Literal((Literal *)&local_40.func);
        return bVar4;
      }
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x1cd);
    }
switchD_00c93c40_caseD_2:
    bVar4 = (this->field_0).i32 == (other->field_0).i32;
  }
  return bVar4;
}

Assistant:

bool Literal::operator==(const Literal& other) const {
  if (type != other.type) {
    return false;
  }
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return true; // special voided literal
      case Type::i32:
      case Type::f32:
        return i32 == other.i32;
      case Type::i64:
      case Type::f64:
        return i64 == other.i64;
      case Type::v128:
        return memcmp(v128, other.v128, 16) == 0;
      case Type::unreachable:
        break;
    }
  } else if (type.isRef()) {
    assert(type.isRef());
    if (type.isNull()) {
      return true;
    }
    if (type.isFunction()) {
      assert(func.is() && other.func.is());
      return func == other.func;
    }
    if (type.isString()) {
      return gcData->values == other.gcData->values;
    }
    if (type.isData()) {
      return gcData == other.gcData;
    }
    assert(type.getHeapType().isBasic());
    if (type.getHeapType().isMaybeShared(HeapType::i31)) {
      return i32 == other.i32;
    }
    if (type.getHeapType().isMaybeShared(HeapType::ext)) {
      return internalize() == other.internalize();
    }
    WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}